

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O0

void deqp::gls::ub::anon_unknown_12::generateValue
               (UniformLayoutEntry *entry,void *basePtr,Random *rnd)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  DataType DVar5;
  int iVar6;
  int iVar7;
  float fVar8;
  deUint32 dVar9;
  float *pfVar10;
  float local_9c;
  int local_8c;
  int local_7c;
  int local_70;
  int local_6c;
  deUint8 *compPtr;
  int compNdx;
  deUint8 *vecPtr;
  int vecNdx;
  deUint8 *elemPtr;
  int elemNdx;
  int compSize;
  bool isArray;
  int vecSize;
  int numVecs;
  bool isMatrix;
  int scalarSize;
  DataType scalarType;
  Random *rnd_local;
  void *basePtr_local;
  UniformLayoutEntry *entry_local;
  
  DVar5 = glu::getDataTypeScalarType(entry->type);
  iVar6 = glu::getDataTypeScalarSize(entry->type);
  bVar3 = glu::isDataTypeMatrix(entry->type);
  if (bVar3) {
    if ((entry->isRowMajor & 1U) == 0) {
      local_6c = glu::getDataTypeMatrixNumColumns(entry->type);
    }
    else {
      local_6c = glu::getDataTypeMatrixNumRows(entry->type);
    }
    local_70 = local_6c;
  }
  else {
    local_70 = 1;
  }
  iVar1 = entry->size;
  for (elemPtr._0_4_ = 0; (int)elemPtr < entry->size; elemPtr._0_4_ = (int)elemPtr + 1) {
    iVar2 = entry->offset;
    if (iVar1 < 2) {
      local_7c = 0;
    }
    else {
      local_7c = (int)elemPtr * entry->arrayStride;
    }
    for (vecPtr._4_4_ = 0; vecPtr._4_4_ < local_70; vecPtr._4_4_ = vecPtr._4_4_ + 1) {
      if (bVar3) {
        local_8c = vecPtr._4_4_ * entry->matrixStride;
      }
      else {
        local_8c = 0;
      }
      for (compPtr._4_4_ = 0; compPtr._4_4_ < iVar6 / local_70; compPtr._4_4_ = compPtr._4_4_ + 1) {
        pfVar10 = (float *)((long)basePtr +
                           (long)(compPtr._4_4_ << 2) +
                           (long)local_8c + (long)local_7c + (long)iVar2);
        switch(DVar5) {
        case TYPE_FLOAT:
          iVar7 = de::Random::getInt(rnd,-9,9);
          *pfVar10 = (float)iVar7;
          break;
        default:
          break;
        case TYPE_INT:
          fVar8 = (float)de::Random::getInt(rnd,-9,9);
          *pfVar10 = fVar8;
          break;
        case TYPE_UINT:
          fVar8 = (float)de::Random::getInt(rnd,0,9);
          *pfVar10 = fVar8;
          break;
        case TYPE_BOOL:
          bVar4 = de::Random::getBool(rnd);
          if (bVar4) {
            dVar9 = de::Random::getUint32(rnd);
            local_9c = (float)(dVar9 | 1);
          }
          else {
            local_9c = 0.0;
          }
          *pfVar10 = local_9c;
        }
      }
    }
  }
  return;
}

Assistant:

void generateValue (const UniformLayoutEntry& entry, void* basePtr, de::Random& rnd)
{
	glu::DataType	scalarType		= glu::getDataTypeScalarType(entry.type);
	int				scalarSize		= glu::getDataTypeScalarSize(entry.type);
	bool			isMatrix		= glu::isDataTypeMatrix(entry.type);
	int				numVecs			= isMatrix ? (entry.isRowMajor ? glu::getDataTypeMatrixNumRows(entry.type) : glu::getDataTypeMatrixNumColumns(entry.type)) : 1;
	int				vecSize			= scalarSize / numVecs;
	bool			isArray			= entry.size > 1;
	const int		compSize		= sizeof(deUint32);

	DE_ASSERT(scalarSize%numVecs == 0);

	for (int elemNdx = 0; elemNdx < entry.size; elemNdx++)
	{
		deUint8* elemPtr = (deUint8*)basePtr + entry.offset + (isArray ? elemNdx*entry.arrayStride : 0);

		for (int vecNdx = 0; vecNdx < numVecs; vecNdx++)
		{
			deUint8* vecPtr = elemPtr + (isMatrix ? vecNdx*entry.matrixStride : 0);

			for (int compNdx = 0; compNdx < vecSize; compNdx++)
			{
				deUint8* compPtr = vecPtr + compSize*compNdx;

				switch (scalarType)
				{
					case glu::TYPE_FLOAT:	*((float*)compPtr)		= (float)rnd.getInt(-9, 9);						break;
					case glu::TYPE_INT:		*((int*)compPtr)		= rnd.getInt(-9, 9);							break;
					case glu::TYPE_UINT:	*((deUint32*)compPtr)	= (deUint32)rnd.getInt(0, 9);					break;
					// \note Random bit pattern is used for true values. Spec states that all non-zero values are
					//       interpreted as true but some implementations fail this.
					case glu::TYPE_BOOL:	*((deUint32*)compPtr)	= rnd.getBool() ? rnd.getUint32()|1u : 0u;		break;
					default:
						DE_ASSERT(false);
				}
			}
		}
	}
}